

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
DeleteProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  ScriptContext *scriptContext;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  uint32 index;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  RecyclableObject *pRVar9;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *this_00;
  byte bVar10;
  ScriptContext *this_01;
  char16_t *form;
  PropertyRecord *local_48;
  SimpleDictionaryPropertyDescriptor<int> *local_40;
  undefined4 *local_38;
  
  local_38 = (undefined4 *)CONCAT44(local_38._4_4_,propertyOperationFlags);
  while (bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)
                 ->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
                 super_DynamicTypeHandler.flags, (bVar1 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  pTVar8 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar8[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar1 & 0x10) != 0) || (*(char *)((long)&pTVar8[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar5) goto LAB_00c97f5c;
      *puVar7 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar8 = (instance->super_RecyclableObject).type.ptr;
  }
  scriptContext = (((pTVar8->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  this_01 = scriptContext;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) goto LAB_00c97f5c;
    *puVar7 = 0;
    this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_48 = ScriptContext::GetPropertyName(this_01,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)(((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                           *)this)->
                        super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
                        propertyMap.ptr,&local_48,&local_40);
  uVar4 = DAT_0145c358;
  if (!bVar5) {
    bVar5 = DynamicObject::HasObjectArray(instance);
    if ((bVar5) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar6 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,
                         (PropertyOperationFlags)local_38);
      return BVar6;
    }
    return 1;
  }
  if ((local_40->Attributes & 8) != 0) {
    return 1;
  }
  if ((local_40->Attributes & 0x12) != 2) {
    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
              ((PropertyOperationFlags)local_38,scriptContext,(PCWSTR)(local_48 + 1));
    return 0;
  }
  if (local_40->propertyIndex == -1) {
LAB_00c97e4a:
    local_40->Attributes = '\x0e';
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
    return 1;
  }
  pRVar9 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).field_0x28;
  if (((int)DAT_0145c358 < 1 || (bVar1 & 2) != 0) ||
     (bVar10 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
               super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
               numDeletedProperties + 1,
     (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
     super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).numDeletedProperties
          = bVar10, bVar10 < uVar4)) {
    pRVar2 = (((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
             super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
             singletonInstance.ptr;
    if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *local_38 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6f4,
                                  "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                  ,
                                  "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                 );
      if (!bVar5) {
LAB_00c97f5c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *local_38 = 0;
    }
    SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
    InvalidateFixedField<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,local_48,
               local_40,(((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
    if (((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
         super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).
         super_DynamicTypeHandler.flags & 0x20) != 0) {
      ScriptContext::InvalidateProtoCaches(scriptContext,propertyId);
    }
    if ((((((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)this)->
          super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>).field_0x28 & 2)
         == 0) ||
       (bVar5 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>::
                TryRegisterDeletedPropertyIndex
                          ((SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false>
                            *)this,instance,local_40->propertyIndex), !bVar5)) {
      DynamicTypeHandler::SetSlotUnchecked(instance,local_40->propertyIndex,pRVar9);
    }
    goto LAB_00c97e4a;
  }
  if (((bVar1 & 4) == 0) &&
     (pRVar9 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                         (&instance->super_RecyclableObject,(RecyclableObject **)0x0),
     pRVar9 == (RecyclableObject *)0x0)) {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
    if (!bVar5) goto LAB_00c97f18;
    form = L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  else {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
    if (!bVar5) goto LAB_00c97f18;
    form = L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n";
  }
  Output::Print(form);
  Output::Flush();
LAB_00c97f18:
  this_00 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
            ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                       instance);
  BVar6 = DeleteProperty_Internal<false>
                    (&this_00->
                      super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>,
                     instance,propertyId,(PropertyOperationFlags)local_38);
  return BVar6;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }